

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_local_file_header(archive_read *a,archive_entry *entry,zip *zip)

{
  int64_t *piVar1;
  byte bVar2;
  uint32_t uVar3;
  zip_entry *zip_entry;
  long lVar4;
  size_t min;
  bool bVar5;
  uint16_t uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  unsigned_long uVar9;
  archive_string_conv *paVar10;
  int *piVar11;
  time_t tVar12;
  ulong min_00;
  wchar_t *__s;
  size_t sVar13;
  int64_t iVar14;
  long lVar15;
  ushort uVar16;
  char *pcVar17;
  uchar *puVar18;
  int iVar19;
  int error_number;
  archive_string_conv **ppaVar20;
  ulong min_01;
  
  zip_entry = zip->entry;
  lVar15 = zip_entry->compressed_size;
  lVar4 = zip_entry->uncompressed_size;
  uVar3 = zip_entry->cm_zlib_crc32;
  zip->decompress_init = '\0';
  zip->end_of_entry = '\0';
  zip->entry_compressed_bytes_read = 0;
  zip->entry_uncompressed_bytes_read = 0;
  uVar9 = (*zip->crc32func)(0,(void *)0x0,0);
  zip->entry_crc32 = uVar9;
  if ((zip->sconv == (archive_string_conv *)0x0) && (zip->init_default_conversion == 0)) {
    paVar10 = archive_string_default_conversion_for_read(&a->archive);
    zip->sconv_default = paVar10;
    zip->init_default_conversion = 1;
  }
  piVar11 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
  if (piVar11 == (int *)0x0) {
LAB_004732f0:
    pcVar17 = "Truncated ZIP file header";
    iVar19 = 0x54;
LAB_004732ff:
    archive_set_error(&a->archive,iVar19,pcVar17);
    return L'\xffffffe2';
  }
  if (*piVar11 != 0x4034b50) {
    pcVar17 = "Damaged Zip archive";
    iVar19 = -1;
    goto LAB_004732ff;
  }
  iVar19 = piVar11[1];
  zip_entry->system = *(uchar *)((long)piVar11 + 5);
  bVar2 = *(byte *)((long)piVar11 + 6);
  zip_entry->zip_flags = *(uint16_t *)((long)piVar11 + 6);
  if ((bVar2 & 0x41) != 0) {
    zip->has_encrypted_entries = 1;
    archive_entry_set_is_data_encrypted(entry,'\x01');
    if ((~zip_entry->zip_flags & 0x2041) == 0) {
      archive_entry_set_is_metadata_encrypted(entry,'\x01');
      return L'\xffffffe2';
    }
  }
  zip->init_decryption = (byte)zip_entry->zip_flags & 1;
  zip_entry->compression = (uchar)piVar11[2];
  tVar12 = zip_time((char *)((long)piVar11 + 10));
  zip_entry->mtime = tVar12;
  zip_entry->cm_zlib_crc32 = *(uint32_t *)((long)piVar11 + 0xe);
  puVar18 = (uchar *)((long)piVar11 + 0x11);
  if ((zip_entry->zip_flags & 8) != 0) {
    puVar18 = (uchar *)((long)piVar11 + 0xb);
  }
  zip_entry->decdat = *puVar18;
  zip_entry->compressed_size = (ulong)*(uint *)((long)piVar11 + 0x12);
  zip_entry->uncompressed_size = (ulong)*(uint *)((long)piVar11 + 0x16);
  min_01 = (ulong)*(ushort *)((long)piVar11 + 0x1a);
  min_00 = (ulong)*(ushort *)(piVar11 + 7);
  __archive_read_consume(a,0x1e);
  pcVar17 = (char *)__archive_read_ahead(a,min_01,(ssize_t *)0x0);
  if (pcVar17 == (char *)0x0) goto LAB_004732f0;
  if ((zip_entry->zip_flags & 0x800) == 0) {
    paVar10 = zip->sconv;
    if (paVar10 == (archive_string_conv *)0x0) {
      ppaVar20 = &zip->sconv_default;
      goto LAB_0047316b;
    }
  }
  else {
    ppaVar20 = &zip->sconv_utf8;
    if (zip->sconv_utf8 == (archive_string_conv *)0x0) {
      paVar10 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
      *ppaVar20 = paVar10;
      if (paVar10 == (archive_string_conv *)0x0) {
        return L'\xffffffe2';
      }
    }
LAB_0047316b:
    paVar10 = *ppaVar20;
  }
  wVar7 = _archive_entry_copy_pathname_l(entry,pcVar17,min_01,paVar10);
  if (wVar7 == L'\0') {
    wVar7 = L'\0';
  }
  else {
    piVar11 = __errno_location();
    if (*piVar11 == 0xc) {
      pcVar17 = "Can\'t allocate memory for Pathname";
      iVar19 = 0xc;
      goto LAB_004732ff;
    }
    pcVar17 = archive_string_conversion_charset_name(paVar10);
    archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                      pcVar17);
    wVar7 = L'\xffffffec';
  }
  __archive_read_consume(a,min_01);
  if ((zip_entry->mode & 0xf000) == 0x1000) {
    zip_entry->mode = zip_entry->mode & 0xfff | 0x8000;
  }
  if (zip_entry->mode < 0x1000) {
    __s = archive_entry_pathname_w(entry);
    if (__s == (wchar_t *)0x0) {
      pcVar17 = archive_entry_pathname(entry);
      if (pcVar17 == (char *)0x0) {
        sVar13 = 0;
      }
      else {
        sVar13 = strlen(pcVar17);
      }
      if ((sVar13 == 0) || (uVar16 = 0x4000, pcVar17[sVar13 - 1] != '/')) goto LAB_0047326c;
    }
    else {
      sVar13 = wcslen(__s);
      if ((sVar13 == 0) || (uVar16 = 0x4000, __s[sVar13 - 1] != L'/')) {
LAB_0047326c:
        uVar16 = 0x8000;
      }
    }
    uVar16 = uVar16 | zip_entry->mode;
    zip_entry->mode = uVar16;
    if (uVar16 == 0x4000) {
      uVar6 = 0x41fd;
    }
    else {
      if (uVar16 != 0x8000) goto LAB_004732a4;
      uVar6 = 0x81b4;
    }
    zip_entry->mode = uVar6;
  }
LAB_004732a4:
  pcVar17 = (char *)__archive_read_ahead(a,min_00,(ssize_t *)0x0);
  if (pcVar17 == (char *)0x0) goto LAB_004732f0;
  piVar1 = &zip_entry->compressed_size;
  process_extra(pcVar17,min_00,zip_entry);
  __archive_read_consume(a,min_00);
  if ((zip_entry->flags & 2) != 0) {
    *(byte *)&zip_entry->zip_flags = (byte)zip_entry->zip_flags & 0xf7;
    if (zip_entry->cm_zlib_crc32 == 0) {
      zip_entry->cm_zlib_crc32 = uVar3;
    }
    else if (zip_entry->cm_zlib_crc32 != uVar3 && zip->ignore_crc32 == '\0') {
      archive_set_error(&a->archive,0x54,"Inconsistent CRC32 values");
      wVar7 = L'\xffffffec';
    }
    if (*piVar1 == 0) {
      *piVar1 = lVar15;
    }
    else if (*piVar1 != lVar15) {
      archive_set_error(&a->archive,0x54,
                        "Inconsistent compressed size: %jd in central directory, %jd in local header"
                       );
      wVar7 = L'\xffffffec';
    }
    if (zip_entry->uncompressed_size == 0) {
      zip_entry->uncompressed_size = lVar4;
    }
    else if (zip_entry->uncompressed_size != lVar4) {
      archive_set_error(&a->archive,0x54,
                        "Inconsistent uncompressed size: %jd in central directory, %jd in local header"
                       );
      wVar7 = L'\xffffffec';
    }
  }
  archive_entry_set_mode(entry,(uint)zip_entry->mode);
  archive_entry_set_uid(entry,zip_entry->uid);
  archive_entry_set_gid(entry,zip_entry->gid);
  archive_entry_set_mtime(entry,zip_entry->mtime,0);
  archive_entry_set_ctime(entry,zip_entry->ctime,0);
  archive_entry_set_atime(entry,zip_entry->atime,0);
  if ((zip->entry->mode & 0xf000) != 0xa000) {
    if (((zip_entry->zip_flags & 8) == 0) || (0 < zip_entry->uncompressed_size)) {
      archive_entry_set_size(entry,zip_entry->uncompressed_size);
    }
    goto LAB_004735d7;
  }
  min = *piVar1;
  if ((long)min < 0x10001) {
    archive_entry_set_size(entry,0);
    pcVar17 = (char *)__archive_read_ahead(a,min,(ssize_t *)0x0);
    if (pcVar17 == (char *)0x0) {
      pcVar17 = "Truncated Zip file";
      goto LAB_004735b0;
    }
    paVar10 = zip->sconv;
    if (paVar10 == (archive_string_conv *)0x0) {
      if ((zip->entry->zip_flags & 0x800) == 0) {
        paVar10 = (archive_string_conv *)0x0;
      }
      else {
        paVar10 = zip->sconv_utf8;
      }
    }
    if (paVar10 == (archive_string_conv *)0x0) {
      paVar10 = zip->sconv_default;
    }
    wVar8 = _archive_entry_copy_symlink_l(entry,pcVar17,min,paVar10);
    if (wVar8 != L'\0') {
      piVar11 = __errno_location();
      if (((*piVar11 != 0xc) && (paVar10 == zip->sconv_utf8)) &&
         ((zip->entry->zip_flags & 0x800) != 0)) {
        _archive_entry_copy_symlink_l(entry,pcVar17,min,(archive_string_conv *)0x0);
      }
      if (*piVar11 != 0xc) {
        if ((paVar10 != zip->sconv_utf8) || ((zip->entry->zip_flags & 0x800) == 0)) {
          pcVar17 = archive_string_conversion_charset_name(paVar10);
          archive_set_error(&a->archive,0x54,
                            "Symlink cannot be converted from %s to current locale.",pcVar17);
          wVar7 = L'\xffffffec';
        }
        goto LAB_0047358e;
      }
      pcVar17 = "Can\'t allocate memory for Symlink";
      error_number = 0xc;
      goto LAB_004735ba;
    }
LAB_0047358e:
    *piVar1 = 0;
    zip_entry->uncompressed_size = 0;
    iVar14 = __archive_read_consume(a,min);
    bVar5 = true;
    if (iVar14 < 0) {
      pcVar17 = "Read error skipping symlink target name";
      goto LAB_004735b0;
    }
  }
  else {
    pcVar17 = "Zip file with oversized link entry";
LAB_004735b0:
    error_number = -1;
LAB_004735ba:
    bVar5 = false;
    archive_set_error(&a->archive,error_number,pcVar17);
  }
  if (!bVar5) {
    return L'\xffffffe2';
  }
LAB_004735d7:
  lVar15 = zip_entry->compressed_size;
  zip->entry_bytes_remaining = lVar15;
  if (lVar15 < 1 && (zip_entry->zip_flags & 8) == 0) {
    zip->end_of_entry = '\x01';
  }
  lVar15 = 8;
  pcVar17 = "??";
  do {
    if (*(uint *)((long)&PTR_bid_keyword_keys_u_00619808 + lVar15) == (uint)zip->entry->compression)
    {
      pcVar17 = *(char **)((long)&compression_methods[0].id + lVar15);
      break;
    }
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x178);
  archive_string_sprintf
            (&zip->format_name,"ZIP %d.%d (%s)",(ulong)(uint)((int)(char)iVar19 / 10),
             (ulong)(uint)((int)(char)iVar19 % 10),pcVar17);
  (a->archive).archive_format_name = (zip->format_name).s;
  return wVar7;
}

Assistant:

static int
zip_read_local_file_header(struct archive_read *a, struct archive_entry *entry,
    struct zip *zip)
{
	const char *p;
	const void *h;
	const wchar_t *wp;
	const char *cp;
	size_t len, filename_length, extra_length;
	struct archive_string_conv *sconv;
	struct zip_entry *zip_entry = zip->entry;
	struct zip_entry zip_entry_central_dir;
	int ret = ARCHIVE_OK;
	char version;

	/* Save a copy of the original for consistency checks. */
	zip_entry_central_dir = *zip_entry;

	zip->decompress_init = 0;
	zip->end_of_entry = 0;
	zip->entry_uncompressed_bytes_read = 0;
	zip->entry_compressed_bytes_read = 0;
	zip->entry_crc32 = zip->crc32func(0, NULL, 0);

	/* Setup default conversion. */
	if (zip->sconv == NULL && !zip->init_default_conversion) {
		zip->sconv_default =
		    archive_string_default_conversion_for_read(&(a->archive));
		zip->init_default_conversion = 1;
	}

	if ((p = __archive_read_ahead(a, 30, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}

	if (memcmp(p, "PK\003\004", 4) != 0) {
		archive_set_error(&a->archive, -1, "Damaged Zip archive");
		return ARCHIVE_FATAL;
	}
	version = p[4];
	zip_entry->system = p[5];
	zip_entry->zip_flags = archive_le16dec(p + 6);
	if (zip_entry->zip_flags & (ZIP_ENCRYPTED | ZIP_STRONG_ENCRYPTED)) {
		zip->has_encrypted_entries = 1;
		archive_entry_set_is_data_encrypted(entry, 1);
		if (zip_entry->zip_flags & ZIP_CENTRAL_DIRECTORY_ENCRYPTED &&
			zip_entry->zip_flags & ZIP_ENCRYPTED &&
			zip_entry->zip_flags & ZIP_STRONG_ENCRYPTED) {
			archive_entry_set_is_metadata_encrypted(entry, 1);
			return ARCHIVE_FATAL;
		}
	}
	zip->init_decryption = (zip_entry->zip_flags & ZIP_ENCRYPTED);
	zip_entry->compression = (char)archive_le16dec(p + 8);
	zip_entry->mtime = zip_time(p + 10);
	zip_entry->crc32 = archive_le32dec(p + 14);
	if (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
		zip_entry->decdat = p[11];
	else
		zip_entry->decdat = p[17];
	zip_entry->compressed_size = archive_le32dec(p + 18);
	zip_entry->uncompressed_size = archive_le32dec(p + 22);
	filename_length = archive_le16dec(p + 26);
	extra_length = archive_le16dec(p + 28);

	__archive_read_consume(a, 30);

	/* Read the filename. */
	if ((h = __archive_read_ahead(a, filename_length, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}
	if (zip_entry->zip_flags & ZIP_UTF8_NAME) {
		/* The filename is stored to be UTF-8. */
		if (zip->sconv_utf8 == NULL) {
			zip->sconv_utf8 =
			    archive_string_conversion_from_charset(
				&a->archive, "UTF-8", 1);
			if (zip->sconv_utf8 == NULL)
				return (ARCHIVE_FATAL);
		}
		sconv = zip->sconv_utf8;
	} else if (zip->sconv != NULL)
		sconv = zip->sconv;
	else
		sconv = zip->sconv_default;

	if (archive_entry_copy_pathname_l(entry,
	    h, filename_length, sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(sconv));
		ret = ARCHIVE_WARN;
	}
	__archive_read_consume(a, filename_length);

	/* Work around a bug in Info-Zip: When reading from a pipe, it
	 * stats the pipe instead of synthesizing a file entry. */
	if ((zip_entry->mode & AE_IFMT) == AE_IFIFO) {
		zip_entry->mode &= ~ AE_IFMT;
		zip_entry->mode |= AE_IFREG;
	}

	if ((zip_entry->mode & AE_IFMT) == 0) {
		/* Especially in streaming mode, we can end up
		   here without having seen proper mode information.
		   Guess from the filename. */
		wp = archive_entry_pathname_w(entry);
		if (wp != NULL) {
			len = wcslen(wp);
			if (len > 0 && wp[len - 1] == L'/')
				zip_entry->mode |= AE_IFDIR;
			else
				zip_entry->mode |= AE_IFREG;
		} else {
			cp = archive_entry_pathname(entry);
			len = (cp != NULL)?strlen(cp):0;
			if (len > 0 && cp[len - 1] == '/')
				zip_entry->mode |= AE_IFDIR;
			else
				zip_entry->mode |= AE_IFREG;
		}
		if (zip_entry->mode == AE_IFDIR) {
			zip_entry->mode |= 0775;
		} else if (zip_entry->mode == AE_IFREG) {
			zip_entry->mode |= 0664;
		}
	}

	/* Read the extra data. */
	if ((h = __archive_read_ahead(a, extra_length, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}

	process_extra(h, extra_length, zip_entry);
	__archive_read_consume(a, extra_length);

	if (zip_entry->flags & LA_FROM_CENTRAL_DIRECTORY) {
		/* If this came from the central dir, it's size info
		 * is definitive, so ignore the length-at-end flag. */
		zip_entry->zip_flags &= ~ZIP_LENGTH_AT_END;
		/* If local header is missing a value, use the one from
		   the central directory.  If both have it, warn about
		   mismatches. */
		if (zip_entry->crc32 == 0) {
			zip_entry->crc32 = zip_entry_central_dir.crc32;
		} else if (!zip->ignore_crc32
		    && zip_entry->crc32 != zip_entry_central_dir.crc32) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent CRC32 values");
			ret = ARCHIVE_WARN;
		}
		if (zip_entry->compressed_size == 0) {
			zip_entry->compressed_size
			    = zip_entry_central_dir.compressed_size;
		} else if (zip_entry->compressed_size
		    != zip_entry_central_dir.compressed_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent compressed size: "
			    "%jd in central directory, %jd in local header",
			    (intmax_t)zip_entry_central_dir.compressed_size,
			    (intmax_t)zip_entry->compressed_size);
			ret = ARCHIVE_WARN;
		}
		if (zip_entry->uncompressed_size == 0) {
			zip_entry->uncompressed_size
			    = zip_entry_central_dir.uncompressed_size;
		} else if (zip_entry->uncompressed_size
		    != zip_entry_central_dir.uncompressed_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent uncompressed size: "
			    "%jd in central directory, %jd in local header",
			    (intmax_t)zip_entry_central_dir.uncompressed_size,
			    (intmax_t)zip_entry->uncompressed_size);
			ret = ARCHIVE_WARN;
		}
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	archive_entry_set_uid(entry, zip_entry->uid);
	archive_entry_set_gid(entry, zip_entry->gid);
	archive_entry_set_mtime(entry, zip_entry->mtime, 0);
	archive_entry_set_ctime(entry, zip_entry->ctime, 0);
	archive_entry_set_atime(entry, zip_entry->atime, 0);

	if ((zip->entry->mode & AE_IFMT) == AE_IFLNK) {
		size_t linkname_length;

		if (zip_entry->compressed_size > 64 * 1024) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Zip file with oversized link entry");
			return ARCHIVE_FATAL;
		}

		linkname_length = (size_t)zip_entry->compressed_size;

		archive_entry_set_size(entry, 0);
		p = __archive_read_ahead(a, linkname_length, NULL);
		if (p == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated Zip file");
			return ARCHIVE_FATAL;
		}

		sconv = zip->sconv;
		if (sconv == NULL && (zip->entry->zip_flags & ZIP_UTF8_NAME))
			sconv = zip->sconv_utf8;
		if (sconv == NULL)
			sconv = zip->sconv_default;
		if (archive_entry_copy_symlink_l(entry, p, linkname_length,
		    sconv) != 0) {
			if (errno != ENOMEM && sconv == zip->sconv_utf8 &&
			    (zip->entry->zip_flags & ZIP_UTF8_NAME))
			    archive_entry_copy_symlink_l(entry, p,
				linkname_length, NULL);
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symlink");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Since there is no character-set regulation for
			 * symlink name, do not report the conversion error
			 * in an automatic conversion.
			 */
			if (sconv != zip->sconv_utf8 ||
			    (zip->entry->zip_flags & ZIP_UTF8_NAME) == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Symlink cannot be converted "
				    "from %s to current locale.",
				    archive_string_conversion_charset_name(
					sconv));
				ret = ARCHIVE_WARN;
			}
		}
		zip_entry->uncompressed_size = zip_entry->compressed_size = 0;

		if (__archive_read_consume(a, linkname_length) < 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Read error skipping symlink target name");
			return ARCHIVE_FATAL;
		}
	} else if (0 == (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
	    || zip_entry->uncompressed_size > 0) {
		/* Set the size only if it's meaningful. */
		archive_entry_set_size(entry, zip_entry->uncompressed_size);
	}
	zip->entry_bytes_remaining = zip_entry->compressed_size;

	/* If there's no body, force read_data() to return EOF immediately. */
	if (0 == (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
	    && zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	/* Set up a more descriptive format name. */
	archive_string_sprintf(&zip->format_name, "ZIP %d.%d (%s)",
	    version / 10, version % 10,
	    compression_name(zip->entry->compression));
	a->archive.archive_format_name = zip->format_name.s;

	return (ret);
}